

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5StructureWrite(Fts5Index *p,Fts5Structure *pStruct)

{
  int iVar1;
  int *piVar2;
  Fts5StructureLevel *pLvl;
  int local_30;
  int iSeg;
  int iCookie;
  int iLvl;
  Fts5Buffer buf;
  Fts5Structure *pStruct_local;
  Fts5Index *p_local;
  
  if (p->rc == 0) {
    buf._8_8_ = pStruct;
    memset(&iCookie,0,0x10);
    local_30 = p->pConfig->iCookie;
    if (local_30 < 0) {
      local_30 = 0;
    }
    iVar1 = sqlite3Fts5BufferSize(&p->rc,(Fts5Buffer *)&iCookie,0x1f);
    if (iVar1 == 0) {
      sqlite3Fts5Put32(_iCookie,local_30);
      buf.p._0_4_ = 4;
      iVar1 = sqlite3Fts5PutVarint(_iCookie + 4,(long)*(int *)(buf._8_8_ + 0x14));
      buf.p._0_4_ = iVar1 + (int)buf.p;
      iVar1 = sqlite3Fts5PutVarint(_iCookie + (int)buf.p,(long)*(int *)(buf._8_8_ + 0x10));
      buf.p._0_4_ = iVar1 + (int)buf.p;
      iVar1 = sqlite3Fts5PutVarint(_iCookie + (int)buf.p,*(u64 *)(buf._8_8_ + 8));
      buf.p._0_4_ = iVar1 + (int)buf.p;
    }
    for (iSeg = 0; iSeg < *(int *)(buf._8_8_ + 0x14); iSeg = iSeg + 1) {
      piVar2 = (int *)(buf._8_8_ + 0x18 + (long)iSeg * 0x10);
      sqlite3Fts5BufferAppendVarint(&p->rc,(Fts5Buffer *)&iCookie,(long)*piVar2);
      sqlite3Fts5BufferAppendVarint(&p->rc,(Fts5Buffer *)&iCookie,(long)piVar2[1]);
      for (pLvl._4_4_ = 0; pLvl._4_4_ < piVar2[1]; pLvl._4_4_ = pLvl._4_4_ + 1) {
        sqlite3Fts5BufferAppendVarint
                  (&p->rc,(Fts5Buffer *)&iCookie,
                   (long)*(int *)(*(long *)(piVar2 + 2) + (long)pLvl._4_4_ * 0xc));
        sqlite3Fts5BufferAppendVarint
                  (&p->rc,(Fts5Buffer *)&iCookie,
                   (long)*(int *)(*(long *)(piVar2 + 2) + (long)pLvl._4_4_ * 0xc + 4));
        sqlite3Fts5BufferAppendVarint
                  (&p->rc,(Fts5Buffer *)&iCookie,
                   (long)*(int *)(*(long *)(piVar2 + 2) + (long)pLvl._4_4_ * 0xc + 8));
      }
    }
    fts5DataWrite(p,10,_iCookie,(int)buf.p);
    sqlite3Fts5BufferFree((Fts5Buffer *)&iCookie);
  }
  return;
}

Assistant:

static void fts5StructureWrite(Fts5Index *p, Fts5Structure *pStruct){
  if( p->rc==SQLITE_OK ){
    Fts5Buffer buf;               /* Buffer to serialize record into */
    int iLvl;                     /* Used to iterate through levels */
    int iCookie;                  /* Cookie value to store */

    assert( pStruct->nSegment==fts5StructureCountSegments(pStruct) );
    memset(&buf, 0, sizeof(Fts5Buffer));

    /* Append the current configuration cookie */
    iCookie = p->pConfig->iCookie;
    if( iCookie<0 ) iCookie = 0;

    if( 0==sqlite3Fts5BufferSize(&p->rc, &buf, 4+9+9+9) ){
      sqlite3Fts5Put32(buf.p, iCookie);
      buf.n = 4;
      fts5BufferSafeAppendVarint(&buf, pStruct->nLevel);
      fts5BufferSafeAppendVarint(&buf, pStruct->nSegment);
      fts5BufferSafeAppendVarint(&buf, (i64)pStruct->nWriteCounter);
    }

    for(iLvl=0; iLvl<pStruct->nLevel; iLvl++){
      int iSeg;                     /* Used to iterate through segments */
      Fts5StructureLevel *pLvl = &pStruct->aLevel[iLvl];
      fts5BufferAppendVarint(&p->rc, &buf, pLvl->nMerge);
      fts5BufferAppendVarint(&p->rc, &buf, pLvl->nSeg);
      assert( pLvl->nMerge<=pLvl->nSeg );

      for(iSeg=0; iSeg<pLvl->nSeg; iSeg++){
        fts5BufferAppendVarint(&p->rc, &buf, pLvl->aSeg[iSeg].iSegid);
        fts5BufferAppendVarint(&p->rc, &buf, pLvl->aSeg[iSeg].pgnoFirst);
        fts5BufferAppendVarint(&p->rc, &buf, pLvl->aSeg[iSeg].pgnoLast);
      }
    }

    fts5DataWrite(p, FTS5_STRUCTURE_ROWID, buf.p, buf.n);
    fts5BufferFree(&buf);
  }
}